

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd_ln.c
# Opt level: O1

void arg_dump_r(cmd_ln_t *cmdln,FILE *fp,arg_t *defn,int32 doc)

{
  int iVar1;
  undefined8 *puVar2;
  long lVar3;
  uint uVar4;
  size_t sVar5;
  void *__base;
  ulong uVar6;
  anytype_t *paVar7;
  uint uVar8;
  ulong uVar9;
  char *pcVar10;
  arg_t *paVar11;
  ulong uVar12;
  uint uVar13;
  long *plVar14;
  ulong uVar15;
  
  if (fp == (FILE *)0x0) {
    return;
  }
  pcVar10 = defn->name;
  if (pcVar10 == (char *)0x0) {
    uVar15 = 0;
    uVar9 = 0;
    uVar13 = 0;
  }
  else {
    paVar11 = defn + 1;
    uVar13 = 0;
    uVar8 = 0;
    uVar9 = 0;
    do {
      sVar5 = strlen(pcVar10);
      uVar15 = sVar5 & 0xffffffff;
      if ((int)sVar5 < (int)uVar9) {
        uVar15 = uVar9;
      }
      if (paVar11[-1].deflt == (char *)0x0) {
        uVar4 = 6;
      }
      else {
        sVar5 = strlen(paVar11[-1].deflt);
        uVar4 = (uint)sVar5;
      }
      if ((int)uVar8 <= (int)uVar4) {
        uVar8 = uVar4;
      }
      pcVar10 = paVar11->name;
      uVar13 = uVar13 + 1;
      paVar11 = paVar11 + 1;
      uVar9 = uVar15;
    } while (pcVar10 != (char *)0x0);
    uVar15 = (ulong)((uint)uVar15 & 0xfffffff8);
    uVar9 = (ulong)(uVar8 & 0xfffffff8);
  }
  uVar12 = 6;
  fwrite("[NAME]",6,1,(FILE *)fp);
  if (6 < (uint)uVar15) {
    do {
      fputc(9,(FILE *)fp);
      uVar12 = uVar12 + 8;
    } while (uVar12 < uVar15);
  }
  fwrite("\t[DEFLT]",8,1,(FILE *)fp);
  if (7 < (uint)uVar9) {
    uVar12 = 7;
    do {
      fputc(9,(FILE *)fp);
      uVar12 = uVar12 + 8;
    } while (uVar12 < uVar9);
  }
  pcVar10 = "\t[DESCR]\n";
  if (doc == 0) {
    pcVar10 = "\t[VALUE]\n";
  }
  fwrite(pcVar10,9,1,(FILE *)fp);
  __base = __ckd_calloc__((long)(int)uVar13,8,
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/util/cmd_ln.c"
                          ,0x95);
  if (0 < (int)uVar13) {
    uVar12 = 0;
    do {
      *(arg_t **)((long)__base + uVar12 * 8) = defn;
      uVar12 = uVar12 + 1;
      defn = defn + 1;
    } while (uVar13 != uVar12);
  }
  qsort(__base,(long)(int)uVar13,8,cmp_name);
  if (0 < (int)uVar13) {
    uVar12 = 0;
    do {
      fputs((char *)**(undefined8 **)((long)__base + uVar12 * 8),(FILE *)fp);
      for (uVar6 = strlen((char *)**(undefined8 **)((long)__base + uVar12 * 8)); uVar6 < uVar15;
          uVar6 = uVar6 + 8) {
        fputc(9,(FILE *)fp);
      }
      fputc(9,(FILE *)fp);
      pcVar10 = *(char **)(*(long *)((long)__base + uVar12 * 8) + 0x10);
      if (pcVar10 == (char *)0x0) {
        sVar5 = 0;
      }
      else {
        fputs(pcVar10,(FILE *)fp);
        sVar5 = strlen(*(char **)(*(long *)((long)__base + uVar12 * 8) + 0x10));
      }
      for (; sVar5 < uVar9; sVar5 = sVar5 + 8) {
        fputc(9,(FILE *)fp);
      }
      fputc(9,(FILE *)fp);
      puVar2 = *(undefined8 **)((long)__base + uVar12 * 8);
      if (doc == 0) {
        paVar7 = cmd_ln_access_r(cmdln,(char *)*puVar2);
        if (paVar7 != (anytype_t *)0x0) {
          iVar1 = *(int *)(*(long *)((long)__base + uVar12 * 8) + 8);
          switch(iVar1) {
          case 2:
          case 3:
            fprintf((FILE *)fp,"%ld",paVar7->ptr);
            break;
          case 4:
          case 5:
            fprintf((FILE *)fp,"%e",paVar7->ptr);
            break;
          case 6:
          case 7:
          case 10:
          case 0xb:
          case 0xc:
          case 0xd:
          case 0xe:
          case 0xf:
switchD_001064a7_caseD_6:
            err_msg(ERR_ERROR,
                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/util/cmd_ln.c"
                    ,0x146,"Unknown argument type: %d\n");
            break;
          case 8:
          case 9:
            pcVar10 = (char *)paVar7->ptr;
            goto LAB_0010645c;
          case 0x10:
          case 0x11:
            pcVar10 = "yes";
            if (paVar7->ptr == (void *)0x0) {
              pcVar10 = "no";
            }
            goto LAB_00106465;
          default:
            if (iVar1 != 0x20) goto switchD_001064a7_caseD_6;
            plVar14 = (long *)paVar7->ptr;
            if (plVar14 != (long *)0x0) {
              lVar3 = *plVar14;
              while (lVar3 != 0) {
                plVar14 = plVar14 + 1;
                fprintf((FILE *)fp,"%s,");
                lVar3 = *plVar14;
              }
            }
          }
        }
      }
      else {
        pcVar10 = (char *)puVar2[3];
LAB_0010645c:
        if (pcVar10 != (char *)0x0) {
LAB_00106465:
          fputs(pcVar10,(FILE *)fp);
        }
      }
      fputc(10,(FILE *)fp);
      uVar12 = uVar12 + 1;
    } while (uVar12 != uVar13);
  }
  ckd_free(__base);
  fputc(10,(FILE *)fp);
  return;
}

Assistant:

static void
arg_dump_r(cmd_ln_t *cmdln, FILE *fp, const arg_t * defn, int32 doc)
{
    arg_t const **pos;
    int32 i, n;
    size_t l;
    int32 namelen, deflen;
    anytype_t *vp;
    char const **array;

    /* No definitions, do nothing. */
    if (defn == NULL || fp == NULL)
        return;

    /* Find max lengths of name and default value fields, and #entries in defn */
    n = arg_strlen(defn, &namelen, &deflen);
    /*    E_INFO("String length %d. Name length %d, Default Length %d\n",n, namelen, deflen); */
    namelen = namelen & 0xfffffff8;     /* Previous tab position */
    deflen = deflen & 0xfffffff8;       /* Previous tab position */

    fprintf(fp, "[NAME]");
    for (l = strlen("[NAME]"); l < namelen; l += 8)
        fprintf(fp, "\t");
    fprintf(fp, "\t[DEFLT]");
    for (l = strlen("[DEFLT]"); l < deflen; l += 8)
        fprintf(fp, "\t");

    if (doc) {
        fprintf(fp, "\t[DESCR]\n");
    }
    else {
        fprintf(fp, "\t[VALUE]\n");
    }

    /* Print current configuration, sorted by name */
    pos = arg_sort(defn, n);
    for (i = 0; i < n; i++) {
        fprintf(fp, "%s", pos[i]->name);
        for (l = strlen(pos[i]->name); l < namelen; l += 8)
            fprintf(fp, "\t");

        fprintf(fp, "\t");
        if (pos[i]->deflt) {
            fprintf(fp, "%s", pos[i]->deflt);
            l = strlen(pos[i]->deflt);
        }
        else
            l = 0;
        for (; l < deflen; l += 8)
            fprintf(fp, "\t");

        fprintf(fp, "\t");
        if (doc) {
            if (pos[i]->doc)
                fprintf(fp, "%s", pos[i]->doc);
        }
        else {
            vp = cmd_ln_access_r(cmdln, pos[i]->name);
            if (vp) {
                switch (pos[i]->type) {
                case ARG_INTEGER:
                case REQARG_INTEGER:
                    fprintf(fp, "%ld", vp->i);
                    break;
                case ARG_FLOATING:
                case REQARG_FLOATING:
                    fprintf(fp, "%e", vp->fl);
                    break;
                case ARG_STRING:
                case REQARG_STRING:
                    if (vp->ptr)
                        fprintf(fp, "%s", (char *)vp->ptr);
                    break;
                case ARG_STRING_LIST:
                    array = (char const**)vp->ptr;
                    if (array)
                        for (l = 0; array[l] != 0; l++) {
                            fprintf(fp, "%s,", array[l]);
                        }
                    break;
                case ARG_BOOLEAN:
                case REQARG_BOOLEAN:
                    fprintf(fp, "%s", vp->i ? "yes" : "no");
                    break;
                default:
                    E_ERROR("Unknown argument type: %d\n", pos[i]->type);
                }
            }
        }

        fprintf(fp, "\n");
    }
    ckd_free(pos);

    fprintf(fp, "\n");
}